

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O3

void run_bitset_container_lazy_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (src_2 != dst) {
    bitset_container_copy(src_2,dst);
  }
  iVar3 = src_1->n_runs;
  if (0 < (long)iVar3) {
    prVar4 = src_1->runs;
    puVar5 = dst->words;
    lVar7 = 0;
    do {
      uVar1 = prVar4[lVar7].value;
      uVar2 = prVar4[lVar7].length;
      uVar8 = (uint)uVar2 + (uint)uVar1;
      uVar9 = (uint)(uVar1 >> 6);
      uVar10 = uVar8 >> 6;
      if (uVar10 - uVar9 == 0) {
        puVar5[uVar9] =
             puVar5[uVar9] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar6 = puVar5[uVar10];
        puVar5[uVar9] = puVar5[uVar9] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar9 + 1 < uVar10) {
          memset(puVar5 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar10 - uVar9) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar5[uVar10] = uVar6 | 0xffffffffffffffffU >> (~(byte)uVar8 & 0x3f);
      }
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void run_bitset_container_lazy_union(const run_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}